

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::GoniometricLight::I(GoniometricLight *this,Vector3f wl,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  Point2f p;
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar7;
  WrapMode2D local_40;
  SampledSpectrum local_38;
  SampledSpectrum local_28;
  
  p = EqualAreaSphereToSquare(wl);
  FVar3 = this->scale;
  auVar6 = (undefined1  [56])0x0;
  SVar7 = DenselySampledSpectrum::Sample(&this->Iemit,lambda);
  auVar4._0_8_ = SVar7.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar7.values.values._8_8_;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar1);
  auVar6 = (undefined1  [56])0x0;
  SVar7 = SampledSpectrum::operator*(&local_38,FVar3);
  auVar5._0_8_ = SVar7.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar7.values.values._8_8_;
  local_28.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar2);
  WrapMode2D::WrapMode2D(&local_40,Clamp);
  FVar3 = Image::LookupNearestChannel(&this->image,p,0,local_40);
  SVar7 = SampledSpectrum::operator*(&local_28,FVar3);
  return (array<float,_4>)(array<float,_4>)SVar7;
}

Assistant:

I(Vector3f wl, const SampledWavelengths &lambda) const {
        Point2f uv = EqualAreaSphereToSquare(wl);
        return scale * Iemit.Sample(lambda) * image.LookupNearestChannel(uv, 0);
    }